

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

PyObject * pybind11::detail::make_object_base_type(PyTypeObject *metaclass)

{
  PyTypeObject *pPVar1;
  int iVar2;
  PyObject *pPVar3;
  handle *phVar4;
  handle local_a0;
  PyObject *local_98;
  handle local_90 [5];
  string local_68 [32];
  PyTypeObject *local_48;
  PyTypeObject *type;
  PyTypeObject *local_30;
  PyHeapTypeObject *heap_type;
  handle local_20;
  object name_obj;
  char *name;
  PyTypeObject *metaclass_local;
  
  name_obj.super_handle.m_ptr = (handle)anon_var_dwarf_261d4;
  pPVar3 = (PyObject *)PyUnicode_FromString();
  handle::handle((handle *)&heap_type,pPVar3);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_20,(handle)heap_type);
  local_30 = (PyTypeObject *)(*metaclass->tp_alloc)(metaclass,0);
  if (local_30 == (PyTypeObject *)0x0) {
    pybind11_fail("make_object_base_type(): error allocating type!");
  }
  phVar4 = handle::inc_ref(&local_20);
  pPVar3 = handle::ptr(phVar4);
  local_30[2].tp_basicsize = (Py_ssize_t)pPVar3;
  phVar4 = handle::inc_ref(&local_20);
  pPVar3 = handle::ptr(phVar4);
  local_30[2].tp_dealloc = (destructor)pPVar3;
  local_48 = local_30;
  local_30->tp_name = "pybind11_object";
  local_30->tp_base = (_typeobject *)&PyBaseObject_Type;
  local_30->tp_basicsize = 0x38;
  local_30->tp_flags = 0x600;
  local_30->tp_new = pybind11_object_new;
  local_30->tp_init = pybind11_object_init;
  local_30->tp_dealloc = pybind11_object_dealloc;
  local_30->tp_weaklistoffset = 0x28;
  iVar2 = PyType_Ready(local_30);
  if (iVar2 < 0) {
    error_string_abi_cxx11_();
    std::operator+((char *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "PyType_Ready failed in make_object_base_type():");
    pybind11_fail(local_68);
  }
  handle::handle(local_90,(PyObject *)local_48);
  str::str((str *)&local_a0,"pybind11_builtins");
  local_98 = local_a0.m_ptr;
  setattr(local_90[0],"__module__",local_a0);
  str::~str((str *)&local_a0);
  iVar2 = PyType_HasFeature(local_48,0x4000);
  pPVar1 = local_30;
  if (iVar2 != 0) {
    __assert_fail("!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/class_support.h"
                  ,0x162,"PyObject *pybind11::detail::make_object_base_type(PyTypeObject *)");
  }
  object::~object((object *)&local_20);
  return (PyObject *)pPVar1;
}

Assistant:

inline PyObject *make_object_base_type(PyTypeObject *metaclass) {
    constexpr auto *name = "pybind11_object";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail("make_object_base_type(): error allocating type!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = &PyBaseObject_Type;
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_new = pybind11_object_new;
    type->tp_init = pybind11_object_init;
    type->tp_dealloc = pybind11_object_dealloc;

    /* Support weak references (needed for the keep_alive feature) */
    type->tp_weaklistoffset = offsetof(instance, weakrefs);

    if (PyType_Ready(type) < 0)
        pybind11_fail("PyType_Ready failed in make_object_base_type():" + error_string());

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));

    assert(!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));
    return (PyObject *) heap_type;
}